

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

data_node_type * __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
split_upwards(Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *this,double key,int stop_propagation_level,
             vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
             *traversal_path,bool reuse_model,model_node_type **new_parent,bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  data_node_type *pdVar5;
  self_type *psVar6;
  byte in_CL;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *in_RDX;
  int in_ESI;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true> *in_RDI;
  uint uVar7;
  long *in_R8;
  byte in_R9B;
  uint uVar8;
  uint uVar9;
  double in_XMM0_Qa;
  double dVar10;
  AlexNode<double,_double> *node;
  iterator __end0;
  iterator __begin0;
  vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  *__range2;
  int i_9;
  int i_8;
  int end_bucketID;
  int mid_bucketID;
  int start_bucketID;
  int repeats;
  int top_bucketID;
  model_node_type *top_node;
  TraversalNode *top_path_node;
  int i_7;
  int i_6;
  int end_bucketID_2;
  int mid_bucketID_2;
  int start_bucketID_2;
  int repeats_2;
  int new_bucketID_1;
  int i_5;
  int right_child_idx;
  int cur_child_repeats_1;
  AlexNode<double,_double> *cur_child_1;
  int cur_1;
  int i_4;
  int j_1;
  int i_3;
  int i_2;
  int end_bucketID_1;
  int mid_bucketID_1;
  int start_bucketID_1;
  int repeats_1;
  int new_bucketID;
  int i_1;
  int j;
  int i;
  int cur_child_repeats;
  AlexNode<double,_double> *cur_child;
  int cur;
  AlexNode<double,_double> *next_right_split;
  AlexNode<double,_double> *next_left_split;
  AlexNode<double,_double> *right_half_first_child;
  AlexNode<double,_double> *left_half_first_child;
  bool pull_up_right_child;
  bool pull_up_left_child;
  model_node_type *right_split;
  model_node_type *left_split;
  bool double_left_half;
  model_node_type *cur_node;
  TraversalNode *path_node;
  int path_idx;
  AlexNode<double,_double> *prev_right_split;
  AlexNode<double,_double> *prev_left_split;
  data_node_type *new_data_node;
  data_node_type *right_leaf;
  data_node_type *left_leaf;
  int mid_boundary;
  double appending_left_bucketID;
  bool right_half_appending_left;
  bool left_half_appending_left;
  bool append_mostly_left;
  double appending_right_bucketID;
  bool right_half_appending_right;
  bool left_half_appending_right;
  bool append_mostly_right;
  int leaf_end_bucketID;
  double leaf_mid_bucketID;
  int leaf_start_bucketID;
  int leaf_repeats;
  data_node_type *leaf;
  model_node_type *parent;
  TraversalNode *parent_path_node;
  vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
  to_delete;
  undefined4 in_stack_fffffffffffffadc;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffae8;
  undefined2 in_stack_fffffffffffffaec;
  short in_stack_fffffffffffffaee;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_stack_fffffffffffffaf0;
  AlexNode<double,_double> *in_stack_fffffffffffffb18;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  int iVar11;
  AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>
  *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  int iVar12;
  undefined8 in_stack_fffffffffffffb68;
  undefined1 compute_cost;
  undefined8 in_stack_fffffffffffffb70;
  data_node_type *in_stack_fffffffffffffb78;
  Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_stack_fffffffffffffb80;
  byte local_271;
  byte local_259;
  __normal_iterator<alex::AlexNode<double,_double>_**,_std::vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>_>
  local_218;
  undefined1 *local_210;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  model_node_type *local_1e8;
  const_reference local_1e0;
  model_node_type *local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  AlexNode<double,_double> *local_1a8;
  int local_19c;
  int local_194;
  int local_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_160;
  int local_15c;
  AlexNode<double,_double> *local_158;
  int local_150;
  data_node_type *local_148;
  data_node_type *local_140;
  AlexNode<double,_double> *local_130;
  AlexNode<double,_double> *local_128;
  byte local_11a;
  byte local_119;
  data_node_type *local_118;
  data_node_type *local_110;
  byte local_101;
  model_node_type *local_100;
  const_reference local_f8;
  int local_ec;
  data_node_type *local_e8;
  data_node_type *local_e0;
  data_node_type *local_d8;
  data_node_type *local_d0;
  data_node_type *local_c8;
  data_node_type *local_c0;
  double local_a8;
  int local_9c;
  double local_98;
  byte local_8b;
  undefined1 local_8a;
  byte local_89;
  double local_88;
  byte local_7f;
  undefined1 local_7e;
  byte local_7d;
  int local_7c;
  double local_78;
  int local_70;
  int local_6c;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *local_68;
  model_node_type *local_60;
  const_reference local_58;
  undefined1 local_50 [31];
  byte local_31;
  long *local_30;
  byte local_21;
  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
  *local_20;
  int local_14;
  double local_10;
  
  compute_cost = (undefined1)((ulong)in_stack_fffffffffffffb68 >> 0x38);
  local_21 = in_CL & 1;
  local_31 = in_R9B & 1;
  if (in_ESI < in_RDI->root_node_->level_) {
    __assert_fail("stop_propagation_level >= root_node_->level_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x728,
                  "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  local_30 = in_R8;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  std::vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>::
  vector((vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
          *)0x11e185);
  local_58 = std::
             vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
             ::back((vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                     *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
  local_60 = local_58->node;
  local_68 = (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
              *)local_60->children_[local_58->bucketID];
  local_6c = 1 << ((local_68->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
  local_70 = local_58->bucketID - local_58->bucketID % local_6c;
  local_78 = (double)local_70 + (double)local_6c / 2.0;
  local_7c = local_70 + local_6c;
  (in_RDI->stats_).num_sideways_splits = (in_RDI->stats_).num_sideways_splits + 1;
  (in_RDI->stats_).num_sideways_split_keys =
       (long)local_68->num_keys_ + (in_RDI->stats_).num_sideways_split_keys;
  local_7d = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
             ::is_append_mostly_right(local_68);
  local_7e = 0;
  local_7f = 0;
  if ((bool)local_7d) {
    local_88 = LinearModel<double>::predict_double
                         (&(local_60->super_AlexNode<double,_double>).model_,local_68->max_key_);
    if ((local_88 < (double)local_70) || (local_78 <= local_88)) {
      if ((local_78 <= local_88) && (local_88 < (double)local_7c)) {
        local_7f = 1;
      }
    }
    else {
      local_7e = 1;
    }
  }
  local_89 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
             ::is_append_mostly_left(local_68);
  local_8a = 0;
  local_8b = 0;
  if ((bool)local_89) {
    local_98 = LinearModel<double>::predict_double
                         (&(local_60->super_AlexNode<double,_double>).model_,local_68->min_key_);
    if ((local_98 < (double)local_70) || (local_78 <= local_98)) {
      if ((local_78 <= local_98) && (local_98 < (double)local_7c)) {
        local_8b = 1;
      }
    }
    else {
      local_8a = 1;
    }
  }
  local_a8 = (local_78 - (local_60->super_AlexNode<double,_double>).model_.b_) /
             (local_60->super_AlexNode<double,_double>).model_.a_;
  local_9c = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
             ::lower_bound<double>
                       (in_stack_fffffffffffffaf0,
                        (double *)
                        CONCAT26(in_stack_fffffffffffffaee,
                                 CONCAT24(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)));
  local_c0 = bulk_load_leaf_node_from_existing
                       (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                        (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                        (int)in_stack_fffffffffffffb70,(bool)compute_cost,
                        (FTNode *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0),
                        SUB81((ulong)in_stack_fffffffffffffb58 >> 0x30,0),
                        SUB81((ulong)in_stack_fffffffffffffb58 >> 0x28,0));
  local_259 = 0;
  if ((local_7d & 1) != 0) {
    local_259 = local_7f;
  }
  local_271 = 0;
  if ((local_89 & 1) != 0) {
    local_271 = local_8b;
  }
  uVar9 = local_271 & 1;
  uVar8 = local_259 & 1;
  uVar7 = local_21 & 1;
  local_c8 = bulk_load_leaf_node_from_existing
                       (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                        (int)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                        (int)in_stack_fffffffffffffb70,(bool)compute_cost,
                        (FTNode *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0),
                        SUB81((ulong)in_stack_fffffffffffffb58 >> 0x30,0),
                        SUB81((ulong)in_stack_fffffffffffffb58 >> 0x28,0));
  (local_c0->super_AlexNode<double,_double>).duplication_factor_ =
       (local_68->super_AlexNode<double,_double>).duplication_factor_;
  (local_c8->super_AlexNode<double,_double>).duplication_factor_ =
       (local_68->super_AlexNode<double,_double>).duplication_factor_;
  (local_c0->super_AlexNode<double,_double>).level_ =
       (local_68->super_AlexNode<double,_double>).level_;
  (local_c8->super_AlexNode<double,_double>).level_ =
       (local_68->super_AlexNode<double,_double>).level_;
  link_data_nodes(in_RDI,local_68,local_c0,local_c8);
  local_d0 = local_68;
  std::vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>::
  push_back((vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
             *)CONCAT44(in_stack_fffffffffffffae4,uVar8),
            (value_type *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
  (in_RDI->stats_).num_data_nodes = (in_RDI->stats_).num_data_nodes + -1;
  if ((local_31 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[Splitting upwards data node] level ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(local_68->super_AlexNode<double,_double>).level_);
    poVar2 = std::operator<<(poVar2,", node addr: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,", node repeats in parent: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_6c);
    poVar2 = std::operator<<(poVar2,", node indexes in parent: [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_70);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7c);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::operator<<(poVar2,", left leaf indexes: [0, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_9c);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::operator<<(poVar2,", right leaf indexes: [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_9c);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_68->data_capacity_);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::operator<<(poVar2,", new nodes addr: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c0);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  dVar10 = LinearModel<double>::predict_double
                     (&(local_60->super_AlexNode<double,_double>).model_,local_10);
  if (local_78 <= dVar10) {
    local_d8 = local_c8;
  }
  else {
    local_d8 = local_c0;
  }
  local_e0 = local_c0;
  local_e8 = local_c8;
  sVar3 = std::
          vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
          ::size(local_20);
  local_ec = (int)sVar3;
  do {
    local_ec = local_ec + -1;
    pvVar4 = std::
             vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
             ::operator[](local_20,(long)local_ec);
    iVar11 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
    if ((pvVar4->node->super_AlexNode<double,_double>).level_ <= local_14) {
      local_1e0 = std::
                  vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                  ::operator[](local_20,(long)local_ec);
      local_1e8 = local_1e0->node;
      if ((local_1e8->super_AlexNode<double,_double>).level_ == local_14) {
        iVar12 = local_ec;
        sVar3 = std::
                vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
                ::size(local_20);
        if (iVar12 == (int)sVar3 + -1) {
          *local_30 = (long)local_1e8;
        }
        local_1ec = local_1e0->bucketID;
        local_1f0 = 1 << ((local_e0->super_AlexNode<double,_double>).duplication_factor_ & 0x1f);
        if ((local_31 & 1) != 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"[Splitting upwards top node] level ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
          poVar2 = std::operator<<(poVar2,", node addr: ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1e8);
          poVar2 = std::operator<<(poVar2,", node children: ");
          in_stack_fffffffffffffb30 =
               (AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)
               std::ostream::operator<<(poVar2,local_1e8->num_children_);
          poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffb30,", child index: ");
          in_stack_fffffffffffffb20 =
               (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                *)std::ostream::operator<<(poVar2,local_1ec);
          iVar11 = (int)((ulong)poVar2 >> 0x20);
          in_stack_fffffffffffffb18 =
               (AlexNode<double,_double> *)
               std::operator<<((ostream *)in_stack_fffffffffffffb20,", child repeats in node: ");
          poVar2 = (ostream *)
                   std::ostream::operator<<((ostream *)in_stack_fffffffffffffb18,local_1f0);
          poVar2 = std::operator<<(poVar2,", node repeats in parent: ");
          poVar2 = (ostream *)
                   std::ostream::operator<<
                             (poVar2,1 << ((local_1e8->super_AlexNode<double,_double>).
                                           duplication_factor_ & 0x1f));
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        if (local_1f0 == 1) {
          (in_RDI->stats_).num_model_node_expansions =
               (in_RDI->stats_).num_model_node_expansions + 1;
          (in_RDI->stats_).num_model_node_expansion_pointers =
               (in_RDI->stats_).num_model_node_expansion_pointers + (long)local_1e8->num_children_;
          AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::expand
                    (in_stack_fffffffffffffb30,iVar11);
          local_1ec = local_1ec << 1;
          local_1f0 = local_1f0 << 1;
        }
        else {
          (local_e0->super_AlexNode<double,_double>).duplication_factor_ =
               (local_e0->super_AlexNode<double,_double>).duplication_factor_ + 0xff;
          (local_e8->super_AlexNode<double,_double>).duplication_factor_ =
               (local_e8->super_AlexNode<double,_double>).duplication_factor_ + 0xff;
        }
        local_1f4 = local_1ec - local_1ec % local_1f0;
        local_1f8 = local_1f4 + local_1f0 / 2;
        local_1fc = local_1f4 + local_1f0;
        for (local_200 = local_1f4; local_204 = local_1f8, local_200 < local_1f8;
            local_200 = local_200 + 1) {
          local_1e8->children_[local_200] = &local_e0->super_AlexNode<double,_double>;
        }
        for (; local_204 < local_1fc; local_204 = local_204 + 1) {
          local_1e8->children_[local_204] = &local_e8->super_AlexNode<double,_double>;
        }
        local_210 = local_50;
        local_218._M_current =
             (AlexNode<double,_double> **)
             std::
             vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
             ::begin((vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                      *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
        std::
        vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
        ::end((vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
               *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<alex::AlexNode<double,_double>_**,_std::vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffae4,uVar8),
                                  (__normal_iterator<alex::AlexNode<double,_double>_**,_std::vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffadc,uVar7)), bVar1) {
          __gnu_cxx::
          __normal_iterator<alex::AlexNode<double,_double>_**,_std::vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>_>
          ::operator*(&local_218);
          delete_node(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
          __gnu_cxx::
          __normal_iterator<alex::AlexNode<double,_double>_**,_std::vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>_>
          ::operator++(&local_218);
        }
        std::
        vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
        ::~vector((vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                   *)local_d8);
        return local_d8;
      }
      __assert_fail("top_node->level_ == stop_propagation_level",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                    ,0x846,
                    "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                   );
    }
    local_f8 = std::
               vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
               ::operator[](local_20,(long)local_ec);
    local_100 = local_f8->node;
    (in_RDI->stats_).num_model_node_splits = (in_RDI->stats_).num_model_node_splits + 1;
    (in_RDI->stats_).num_model_node_split_pointers =
         (long)local_100->num_children_ + (in_RDI->stats_).num_model_node_split_pointers;
    local_101 = local_f8->bucketID < local_100->num_children_ / 2;
    local_110 = (data_node_type *)0x0;
    local_118 = (data_node_type *)0x0;
    local_119 = 0;
    local_11a = 0;
    local_128 = *local_100->children_;
    local_130 = local_100->children_[local_100->num_children_ / 2];
    if (((bool)local_101) &&
       (1 << (local_130->duplication_factor_ & 0x1f) == local_100->num_children_ / 2)) {
      local_11a = 1;
      model_node_allocator
                ((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                  *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
      pdVar5 = (data_node_type *)
               __gnu_cxx::
               new_allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
                           *)in_stack_fffffffffffffaf0,
                          CONCAT26(in_stack_fffffffffffffaee,
                                   CONCAT24(in_stack_fffffffffffffaec,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffae4,uVar8));
      AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::AlexModelNode
                ((AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)
                 in_stack_fffffffffffffaf0,in_stack_fffffffffffffaee,
                 (allocator<std::pair<double,_double>_> *)CONCAT44(in_stack_fffffffffffffae4,uVar8))
      ;
      local_110 = pdVar5;
      std::
      allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
                  *)0x11ecc7);
    }
    else if (((bool)local_101) ||
            (1 << (local_128->duplication_factor_ & 0x1f) != local_100->num_children_ / 2)) {
      model_node_allocator
                ((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                  *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
      pdVar5 = (data_node_type *)
               __gnu_cxx::
               new_allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
                           *)in_stack_fffffffffffffaf0,
                          CONCAT26(in_stack_fffffffffffffaee,
                                   CONCAT24(in_stack_fffffffffffffaec,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffae4,uVar8));
      AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::AlexModelNode
                ((AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)
                 in_stack_fffffffffffffaf0,in_stack_fffffffffffffaee,
                 (allocator<std::pair<double,_double>_> *)CONCAT44(in_stack_fffffffffffffae4,uVar8))
      ;
      local_110 = pdVar5;
      std::
      allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
                  *)0x11ee79);
      model_node_allocator
                ((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                  *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
      pdVar5 = (data_node_type *)
               __gnu_cxx::
               new_allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
                           *)in_stack_fffffffffffffaf0,
                          CONCAT26(in_stack_fffffffffffffaee,
                                   CONCAT24(in_stack_fffffffffffffaec,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffae4,uVar8));
      AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::AlexModelNode
                ((AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)
                 in_stack_fffffffffffffaf0,in_stack_fffffffffffffaee,
                 (allocator<std::pair<double,_double>_> *)CONCAT44(in_stack_fffffffffffffae4,uVar8))
      ;
      local_118 = pdVar5;
      std::
      allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
                  *)0x11eefd);
    }
    else {
      local_119 = 1;
      model_node_allocator
                ((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                  *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
      pdVar5 = (data_node_type *)
               __gnu_cxx::
               new_allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
                           *)in_stack_fffffffffffffaf0,
                          CONCAT26(in_stack_fffffffffffffaee,
                                   CONCAT24(in_stack_fffffffffffffaec,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffae4,uVar8));
      AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::AlexModelNode
                ((AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *)
                 in_stack_fffffffffffffaf0,in_stack_fffffffffffffaee,
                 (allocator<std::pair<double,_double>_> *)CONCAT44(in_stack_fffffffffffffae4,uVar8))
      ;
      local_118 = pdVar5;
      std::
      allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>_>
                  *)0x11edca);
    }
    iVar11 = local_ec;
    local_140 = (data_node_type *)0x0;
    local_148 = (data_node_type *)0x0;
    if ((local_101 & 1) == 0) {
      if (local_118 == (data_node_type *)0x0) {
        __assert_fail("right_split != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x7ed,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      sVar3 = std::
              vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
              ::size(local_20);
      if (iVar11 == (int)sVar3 + -1) {
        *local_30 = (long)local_118;
      }
      if ((local_119 & 1) == 0) {
        *(int *)&local_110->allocator_ = local_100->num_children_ / 2;
        pointer_allocator((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                           *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
        psVar6 = (self_type *)
                 __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                           ((new_allocator<alex::AlexNode<double,_double>_*> *)
                            in_stack_fffffffffffffaf0,
                            CONCAT26(in_stack_fffffffffffffaee,
                                     CONCAT24(in_stack_fffffffffffffaec,uVar9)),
                            (void *)CONCAT44(in_stack_fffffffffffffae4,uVar8));
        local_110->next_leaf_ = psVar6;
        std::allocator<alex::AlexNode<double,_double>_*>::~allocator
                  ((allocator<alex::AlexNode<double,_double>_*> *)0x11f695);
        (local_110->super_AlexNode<double,_double>).model_.a_ =
             (local_100->super_AlexNode<double,_double>).model_.a_;
        (local_110->super_AlexNode<double,_double>).model_.b_ =
             (local_100->super_AlexNode<double,_double>).model_.b_;
        local_190 = 0;
        for (local_194 = 0; local_194 < local_100->num_children_ / 2; local_194 = local_194 + 1) {
          (&(local_110->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[local_190] =
               (_func_int **)local_100->children_[local_194];
          local_190 = local_190 + 1;
        }
        local_140 = local_110;
      }
      else {
        local_140 = (data_node_type *)*local_100->children_;
        (local_140->super_AlexNode<double,_double>).level_ =
             (local_100->super_AlexNode<double,_double>).level_;
      }
      *(int *)&local_118->allocator_ = local_100->num_children_;
      pointer_allocator((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                         *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
      psVar6 = (self_type *)
               __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                         ((new_allocator<alex::AlexNode<double,_double>_*> *)
                          in_stack_fffffffffffffaf0,
                          CONCAT26(in_stack_fffffffffffffaee,
                                   CONCAT24(in_stack_fffffffffffffaec,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffae4,uVar8));
      local_118->next_leaf_ = psVar6;
      std::allocator<alex::AlexNode<double,_double>_*>::~allocator
                ((allocator<alex::AlexNode<double,_double>_*> *)0x11f815);
      (local_118->super_AlexNode<double,_double>).model_.a_ =
           (local_100->super_AlexNode<double,_double>).model_.a_ * 2.0;
      (local_118->super_AlexNode<double,_double>).model_.b_ =
           ((local_100->super_AlexNode<double,_double>).model_.b_ -
           (double)(local_100->num_children_ / 2)) * 2.0;
      for (local_19c = local_100->num_children_ / 2; local_19c < local_100->num_children_;
          local_19c = local_1ac + local_19c) {
        local_1a8 = local_100->children_[local_19c];
        local_1ac = 1 << (local_1a8->duplication_factor_ & 0x1f);
        local_1b0 = local_19c - local_100->num_children_ / 2;
        for (local_1b4 = local_1b0 * 2;
            SBORROW4(local_1b4,(local_1b0 + local_1ac) * 2) !=
            local_1b4 + (local_1b0 + local_1ac) * -2 < 0; local_1b4 = local_1b4 + 1) {
          (&(local_118->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[local_1b4] =
               (_func_int **)local_1a8;
        }
        local_1a8->duplication_factor_ = local_1a8->duplication_factor_ + '\x01';
      }
      if (local_19c != local_100->num_children_) {
        __assert_fail("cur == cur_node->num_children_",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x816,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      local_1b8 = (local_f8->bucketID - local_100->num_children_ / 2) * 2;
      local_1bc = 1 << ((local_e0->super_AlexNode<double,_double>).duplication_factor_ + 1 & 0x1f);
      local_1c0 = local_1b8 - local_1b8 % local_1bc;
      local_1c4 = local_1c0 + local_1bc / 2;
      local_1c8 = local_1c0 + local_1bc;
      for (local_1cc = local_1c0; local_1d0 = local_1c4, local_1cc < local_1c4;
          local_1cc = local_1cc + 1) {
        (&(local_118->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[local_1cc] =
             (_func_int **)local_e0;
      }
      for (; local_1d0 < local_1c8; local_1d0 = local_1d0 + 1) {
        (&(local_118->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[local_1d0] =
             (_func_int **)local_e8;
      }
      local_148 = local_118;
    }
    else {
      if (local_110 == (data_node_type *)0x0) {
        __assert_fail("left_split != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x7b2,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      sVar3 = std::
              vector<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode,_std::allocator<alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::TraversalNode>_>
              ::size(local_20);
      if (iVar11 == (int)sVar3 + -1) {
        *local_30 = (long)local_110;
      }
      *(int *)&local_110->allocator_ = local_100->num_children_;
      pointer_allocator((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                         *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
      psVar6 = (self_type *)
               __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                         ((new_allocator<alex::AlexNode<double,_double>_*> *)
                          in_stack_fffffffffffffaf0,
                          CONCAT26(in_stack_fffffffffffffaee,
                                   CONCAT24(in_stack_fffffffffffffaec,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffae4,uVar8));
      local_110->next_leaf_ = psVar6;
      std::allocator<alex::AlexNode<double,_double>_*>::~allocator
                ((allocator<alex::AlexNode<double,_double>_*> *)0x11f059);
      (local_110->super_AlexNode<double,_double>).model_.a_ =
           (local_100->super_AlexNode<double,_double>).model_.a_ * 2.0;
      (local_110->super_AlexNode<double,_double>).model_.b_ =
           (local_100->super_AlexNode<double,_double>).model_.b_ * 2.0;
      for (local_150 = 0; local_150 < local_100->num_children_ / 2;
          local_150 = local_15c + local_150) {
        local_158 = local_100->children_[local_150];
        local_15c = 1 << (local_158->duplication_factor_ & 0x1f);
        for (local_160 = local_150 << 1;
            SBORROW4(local_160,(local_150 + local_15c) * 2) !=
            local_160 + (local_150 + local_15c) * -2 < 0; local_160 = local_160 + 1) {
          (&(local_110->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[local_160] =
               (_func_int **)local_158;
        }
        local_158->duplication_factor_ = local_158->duplication_factor_ + '\x01';
      }
      if (local_150 != local_100->num_children_ / 2) {
        __assert_fail("cur == cur_node->num_children_ / 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                      ,0x7c6,
                      "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                     );
      }
      if ((local_11a & 1) == 0) {
        *(int *)&local_118->allocator_ = local_100->num_children_ / 2;
        pointer_allocator((Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                           *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
        psVar6 = (self_type *)
                 __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                           ((new_allocator<alex::AlexNode<double,_double>_*> *)
                            in_stack_fffffffffffffaf0,
                            CONCAT26(in_stack_fffffffffffffaee,
                                     CONCAT24(in_stack_fffffffffffffaec,uVar9)),
                            (void *)CONCAT44(in_stack_fffffffffffffae4,uVar8));
        local_118->next_leaf_ = psVar6;
        std::allocator<alex::AlexNode<double,_double>_*>::~allocator
                  ((allocator<alex::AlexNode<double,_double>_*> *)0x11f2fd);
        (local_118->super_AlexNode<double,_double>).model_.a_ =
             (local_100->super_AlexNode<double,_double>).model_.a_;
        (local_118->super_AlexNode<double,_double>).model_.b_ =
             (local_100->super_AlexNode<double,_double>).model_.b_ -
             (double)(local_100->num_children_ / 2);
        local_168 = 0;
        for (local_16c = local_100->num_children_ / 2; local_16c < local_100->num_children_;
            local_16c = local_16c + 1) {
          (&(local_118->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[local_168] =
               (_func_int **)local_100->children_[local_16c];
          local_168 = local_168 + 1;
        }
        local_148 = local_118;
      }
      else {
        local_148 = (data_node_type *)local_100->children_[local_100->num_children_ / 2];
        (local_148->super_AlexNode<double,_double>).level_ =
             (local_100->super_AlexNode<double,_double>).level_;
      }
      local_170 = local_f8->bucketID * 2;
      local_174 = 1 << ((local_e0->super_AlexNode<double,_double>).duplication_factor_ + 1 & 0x1f);
      local_178 = local_170 - local_170 % local_174;
      local_17c = local_178 + local_174 / 2;
      local_180 = local_178 + local_174;
      for (local_184 = local_178; local_188 = local_17c, local_184 < local_17c;
          local_184 = local_184 + 1) {
        (&(local_110->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[local_184] =
             (_func_int **)local_e0;
      }
      for (; local_188 < local_180; local_188 = local_188 + 1) {
        (&(local_110->next_leaf_->super_AlexNode<double,_double>)._vptr_AlexNode)[local_188] =
             (_func_int **)local_e8;
      }
      local_140 = local_110;
    }
    if (local_140 == (data_node_type *)0x0 || local_148 == (data_node_type *)0x0) {
      __assert_fail("next_left_split != nullptr && next_right_split != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                    ,0x829,
                    "data_node_type *alex::Alex<double, double>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                   );
    }
    if ((local_31 & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[Splitting upwards through-node] level ");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,(local_100->super_AlexNode<double,_double>).level_);
      poVar2 = std::operator<<(poVar2,", node addr: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_f8->node);
      poVar2 = std::operator<<(poVar2,", node children: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_f8->node->num_children_);
      poVar2 = std::operator<<(poVar2,", child index: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_f8->bucketID);
      poVar2 = std::operator<<(poVar2,", child repeats in node: ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,1 << ((local_e0->super_AlexNode<double,_double>).
                                       duplication_factor_ & 0x1f));
      poVar2 = std::operator<<(poVar2,", node repeats in parent: ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,1 << ((local_f8->node->super_AlexNode<double,_double>).
                                       duplication_factor_ & 0x1f));
      poVar2 = std::operator<<(poVar2,", new nodes addr: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_110);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_118);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    local_1d8 = local_100;
    std::vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
    ::push_back((vector<alex::AlexNode<double,_double>_*,_std::allocator<alex::AlexNode<double,_double>_*>_>
                 *)CONCAT44(in_stack_fffffffffffffae4,uVar8),
                (value_type *)CONCAT44(in_stack_fffffffffffffadc,uVar7));
    if (((local_119 & 1) == 0) && ((local_11a & 1) == 0)) {
      (in_RDI->stats_).num_model_nodes = (in_RDI->stats_).num_model_nodes + 1;
    }
    (local_140->super_AlexNode<double,_double>).duplication_factor_ =
         (local_100->super_AlexNode<double,_double>).duplication_factor_;
    (local_148->super_AlexNode<double,_double>).duplication_factor_ =
         (local_100->super_AlexNode<double,_double>).duplication_factor_;
    local_e0 = local_140;
    local_e8 = local_148;
  } while( true );
}

Assistant:

data_node_type* split_upwards(
      T key, int stop_propagation_level,
      const std::vector<TraversalNode>& traversal_path, bool reuse_model,
      model_node_type** new_parent, bool verbose = false) {
    assert(stop_propagation_level >= root_node_->level_);
    std::vector<AlexNode<T, P>*> to_delete;  // nodes that need to be deleted

    // Split the data node into two new data nodes
    const TraversalNode& parent_path_node = traversal_path.back();
    model_node_type* parent = parent_path_node.node;
    auto leaf = static_cast<data_node_type*>(
        parent->children_[parent_path_node.bucketID]);
    int leaf_repeats = 1 << (leaf->duplication_factor_);
    int leaf_start_bucketID =
        parent_path_node.bucketID - (parent_path_node.bucketID % leaf_repeats);
    double leaf_mid_bucketID = leaf_start_bucketID + leaf_repeats / 2.0;
    int leaf_end_bucketID =
        leaf_start_bucketID + leaf_repeats;  // first bucket with next child
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    // Determine if either of the two new data nodes will need to adapt to
    // append-mostly behavior
    bool append_mostly_right = leaf->is_append_mostly_right();
    bool left_half_appending_right = false, right_half_appending_right = false;
    if (append_mostly_right) {
      double appending_right_bucketID =
          parent->model_.predict_double(leaf->max_key_);
      if (appending_right_bucketID >= leaf_start_bucketID &&
          appending_right_bucketID < leaf_mid_bucketID) {
        left_half_appending_right = true;
      } else if (appending_right_bucketID >= leaf_mid_bucketID &&
                 appending_right_bucketID < leaf_end_bucketID) {
        right_half_appending_right = true;
      }
    }
    bool append_mostly_left = leaf->is_append_mostly_left();
    bool left_half_appending_left = false, right_half_appending_left = false;
    if (append_mostly_left) {
      double appending_left_bucketID =
          parent->model_.predict_double(leaf->min_key_);
      if (appending_left_bucketID >= leaf_start_bucketID &&
          appending_left_bucketID < leaf_mid_bucketID) {
        left_half_appending_left = true;
      } else if (appending_left_bucketID >= leaf_mid_bucketID &&
                 appending_left_bucketID < leaf_end_bucketID) {
        right_half_appending_left = true;
      }
    }

    int mid_boundary = leaf->lower_bound(
        (leaf_mid_bucketID - parent->model_.b_) / parent->model_.a_);
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        leaf, 0, mid_boundary, true, nullptr, reuse_model,
        append_mostly_right && left_half_appending_right,
        append_mostly_left && left_half_appending_left);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        leaf, mid_boundary, leaf->data_capacity_, true, nullptr, reuse_model,
        append_mostly_right && right_half_appending_right,
        append_mostly_left && right_half_appending_left);
    // This is the expected duplication factor; it will be correct once we
    // split/expand the parent
    left_leaf->duplication_factor_ = leaf->duplication_factor_;
    right_leaf->duplication_factor_ = leaf->duplication_factor_;
    left_leaf->level_ = leaf->level_;
    right_leaf->level_ = leaf->level_;
    link_data_nodes(leaf, left_leaf, right_leaf);
    to_delete.push_back(leaf);
    stats_.num_data_nodes--;

    if (verbose) {
      std::cout << "[Splitting upwards data node] level " << leaf->level_
                << ", node addr: " << leaf
                << ", node repeats in parent: " << leaf_repeats
                << ", node indexes in parent: [" << leaf_start_bucketID << ", "
                << leaf_end_bucketID << ")"
                << ", left leaf indexes: [0, " << mid_boundary << ")"
                << ", right leaf indexes: [" << mid_boundary << ", "
                << leaf->data_capacity_ << ")"
                << ", new nodes addr: " << left_leaf << "," << right_leaf
                << std::endl;
    }

    // The new data node that the key falls into is the one we return
    data_node_type* new_data_node;
    if (parent->model_.predict_double(key) < leaf_mid_bucketID) {
      new_data_node = left_leaf;
    } else {
      new_data_node = right_leaf;
    }

    // Split all internal nodes from the parent up to the highest node along the
    // traversal path.
    // As this happens, the entries of the traversal path will go stale, which
    // is fine because we no longer use them.
    // Splitting an internal node involves dividing the child pointers into two
    // halves, and doubling the relevant half.
    AlexNode<T, P>* prev_left_split = left_leaf;
    AlexNode<T, P>* prev_right_split = right_leaf;
    int path_idx = static_cast<int>(traversal_path.size()) - 1;
    while (traversal_path[path_idx].node->level_ > stop_propagation_level) {
      // Decide which half to double
      const TraversalNode& path_node = traversal_path[path_idx];
      model_node_type* cur_node = path_node.node;
      stats_.num_model_node_splits++;
      stats_.num_model_node_split_pointers += cur_node->num_children_;
      bool double_left_half = path_node.bucketID < cur_node->num_children_ / 2;
      model_node_type* left_split = nullptr;
      model_node_type* right_split = nullptr;

      // If one of the resulting halves will only have one child pointer, we
      // should "pull up" that child
      bool pull_up_left_child = false, pull_up_right_child = false;
      AlexNode<T, P>* left_half_first_child = cur_node->children_[0];
      AlexNode<T, P>* right_half_first_child =
          cur_node->children_[cur_node->num_children_ / 2];
      if (double_left_half &&
          (1 << right_half_first_child->duplication_factor_) ==
              cur_node->num_children_ / 2) {
        // pull up right child if all children in the right half are the same
        pull_up_right_child = true;
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else if (!double_left_half &&
                 (1 << left_half_first_child->duplication_factor_) ==
                     cur_node->num_children_ / 2) {
        // pull up left child if all children in the left half are the same
        pull_up_left_child = true;
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else {
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      }

      // Do the split
      AlexNode<T, P>* next_left_split = nullptr;
      AlexNode<T, P>* next_right_split = nullptr;
      if (double_left_half) {
        // double left half
        assert(left_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = left_split;
        }
        left_split->num_children_ = cur_node->num_children_;
        left_split->children_ =
            new (pointer_allocator().allocate(left_split->num_children_))
                AlexNode<T, P>*[left_split->num_children_];
        left_split->model_.a_ = cur_node->model_.a_ * 2;
        left_split->model_.b_ = cur_node->model_.b_ * 2;
        int cur = 0;
        while (cur < cur_node->num_children_ / 2) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          for (int i = 2 * cur; i < 2 * (cur + cur_child_repeats); i++) {
            left_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_ / 2);

        if (pull_up_right_child) {
          next_right_split = cur_node->children_[cur_node->num_children_ / 2];
          next_right_split->level_ = cur_node->level_;
        } else {
          right_split->num_children_ = cur_node->num_children_ / 2;
          right_split->children_ =
              new (pointer_allocator().allocate(right_split->num_children_))
                  AlexNode<T, P>*[right_split->num_children_];
          right_split->model_.a_ = cur_node->model_.a_;
          right_split->model_.b_ =
              cur_node->model_.b_ - cur_node->num_children_ / 2;
          int j = 0;
          for (int i = cur_node->num_children_ / 2; i < cur_node->num_children_;
               i++) {
            right_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_right_split = right_split;
        }

        int new_bucketID = path_node.bucketID * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          left_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          left_split->children_[i] = prev_right_split;
        }
        next_left_split = left_split;
      } else {
        // double right half
        assert(right_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = right_split;
        }
        if (pull_up_left_child) {
          next_left_split = cur_node->children_[0];
          next_left_split->level_ = cur_node->level_;
        } else {
          left_split->num_children_ = cur_node->num_children_ / 2;
          left_split->children_ =
              new (pointer_allocator().allocate(left_split->num_children_))
                  AlexNode<T, P>*[left_split->num_children_];
          left_split->model_.a_ = cur_node->model_.a_;
          left_split->model_.b_ = cur_node->model_.b_;
          int j = 0;
          for (int i = 0; i < cur_node->num_children_ / 2; i++) {
            left_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_left_split = left_split;
        }

        right_split->num_children_ = cur_node->num_children_;
        right_split->children_ =
            new (pointer_allocator().allocate(right_split->num_children_))
                AlexNode<T, P>*[right_split->num_children_];
        right_split->model_.a_ = cur_node->model_.a_ * 2;
        right_split->model_.b_ =
            (cur_node->model_.b_ - cur_node->num_children_ / 2) * 2;
        int cur = cur_node->num_children_ / 2;
        while (cur < cur_node->num_children_) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          int right_child_idx = cur - cur_node->num_children_ / 2;
          for (int i = 2 * right_child_idx;
               i < 2 * (right_child_idx + cur_child_repeats); i++) {
            right_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_);

        int new_bucketID =
            (path_node.bucketID - cur_node->num_children_ / 2) * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          right_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          right_split->children_[i] = prev_right_split;
        }
        next_right_split = right_split;
      }
      assert(next_left_split != nullptr && next_right_split != nullptr);
      if (verbose) {
        std::cout << "[Splitting upwards through-node] level "
                  << cur_node->level_ << ", node addr: " << path_node.node
                  << ", node children: " << path_node.node->num_children_
                  << ", child index: " << path_node.bucketID
                  << ", child repeats in node: "
                  << (1 << prev_left_split->duplication_factor_)
                  << ", node repeats in parent: "
                  << (1 << path_node.node->duplication_factor_)
                  << ", new nodes addr: " << left_split << "," << right_split
                  << std::endl;
      }
      to_delete.push_back(cur_node);
      if (!pull_up_left_child && !pull_up_right_child) {
        stats_.num_model_nodes++;
      }
      // This is the expected duplication factor; it will be correct once we
      // split/expand the parent
      next_left_split->duplication_factor_ = cur_node->duplication_factor_;
      next_right_split->duplication_factor_ = cur_node->duplication_factor_;
      prev_left_split = next_left_split;
      prev_right_split = next_right_split;
      path_idx--;
    }

    // Insert into the top node
    const TraversalNode& top_path_node = traversal_path[path_idx];
    model_node_type* top_node = top_path_node.node;
    assert(top_node->level_ == stop_propagation_level);
    if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
      *new_parent = top_node;
    }
    int top_bucketID = top_path_node.bucketID;
    int repeats =
        1 << prev_left_split->duplication_factor_;  // this was the duplication
                                                    // factor of the child that
                                                    // was deleted
    if (verbose) {
      std::cout << "[Splitting upwards top node] level "
                << stop_propagation_level << ", node addr: " << top_node
                << ", node children: " << top_node->num_children_
                << ", child index: " << top_bucketID
                << ", child repeats in node: " << repeats
                << ", node repeats in parent: "
                << (1 << top_node->duplication_factor_) << std::endl;
    }

    // Expand the top node if necessary
    if (repeats == 1) {
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += top_node->num_children_;
      top_node->expand(1);  // double size of top node
      top_bucketID *= 2;
      repeats *= 2;
    } else {
      prev_left_split->duplication_factor_--;
      prev_right_split->duplication_factor_--;
    }

    int start_bucketID =
        top_bucketID -
        (top_bucketID % repeats);  // first bucket with same child
    int mid_bucketID = start_bucketID + repeats / 2;
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with next child
    for (int i = start_bucketID; i < mid_bucketID; i++) {
      top_node->children_[i] = prev_left_split;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      top_node->children_[i] = prev_right_split;
    }

    for (auto node : to_delete) {
      delete_node(node);
    }

    return new_data_node;
  }